

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O0

ArrayPtr<const_capnp::word> __thiscall
capnp::anon_unknown_0::AsyncMessageReader::getSegment(AsyncMessageReader *this,uint id)

{
  uint uVar1;
  DirectWireValue<unsigned_int> *this_00;
  word **ppwVar2;
  uint local_3c;
  uint32_t size;
  uint id_local;
  AsyncMessageReader *this_local;
  
  uVar1 = segmentCount(this);
  if (id < uVar1) {
    if (id == 0) {
      local_3c = segment0Size(this);
    }
    else {
      this_00 = kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::operator[]
                          (&this->moreSizes,(ulong)(id - 1));
      local_3c = capnp::_::DirectWireValue<unsigned_int>::get(this_00);
    }
    ppwVar2 = kj::Array<const_capnp::word_*>::operator[](&this->segmentStarts,(ulong)id);
    _this_local = kj::arrayPtr<capnp::word_const>(*ppwVar2,(ulong)local_3c);
  }
  else {
    kj::ArrayPtr<const_capnp::word>::ArrayPtr
              ((ArrayPtr<const_capnp::word> *)&this_local,(void *)0x0);
  }
  return _this_local;
}

Assistant:

kj::ArrayPtr<const word> getSegment(uint id) override {
    if (id >= segmentCount()) {
      return nullptr;
    } else {
      uint32_t size = id == 0 ? segment0Size() : moreSizes[id - 1].get();
      return kj::arrayPtr(segmentStarts[id], size);
    }
  }